

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SanityCheckPass.h
# Opt level: O3

void soul::SanityCheckPass::checkArraySubscript(ArrayElementRef *s)

{
  int iVar1;
  Expression *e;
  
  e = (s->object).object;
  if (e != (Expression *)0x0) {
    if (e->kind != endpoint) goto LAB_001ed388;
    iVar1 = (*(e->super_Statement).super_ASTObject._vptr_ASTObject[3])();
    if ((char)iVar1 != '\0') {
      return;
    }
    e = (s->object).object;
  }
  if (e == (Expression *)0x0) {
    throwInternalCompilerError("object != nullptr","operator*",0x3b);
  }
LAB_001ed388:
  throwErrorIfNotArrayOrVector(e);
  return;
}

Assistant:

static void checkArraySubscript (AST::ArrayElementRef& s)
    {
        if (! AST::isResolvedAsEndpoint (s.object))
            throwErrorIfNotArrayOrVector (*s.object);
    }